

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_ATC_NAVAIDS_FundamentalParameterData.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData::IFF_ATC_NAVAIDS_FundamentalParameterData
          (IFF_ATC_NAVAIDS_FundamentalParameterData *this)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__IFF_ATC_NAVAIDS_FundamentalParameterData_00232ba8;
  this->m_ui16Padding1 = 0;
  this->m_ui8Padding2 = '\0';
  this->m_f32ERP = 0.0;
  this->m_f32Freq = 0.0;
  this->m_f32PgRF = 0.0;
  this->m_f32PulseWidth = 0.0;
  *(undefined8 *)((long)&this->m_f32PulseWidth + 1) = 0;
  return;
}

Assistant:

IFF_ATC_NAVAIDS_FundamentalParameterData::IFF_ATC_NAVAIDS_FundamentalParameterData() :
    m_f32ERP( 0 ),
    m_f32Freq( 0 ),
    m_f32PgRF( 0 ),
    m_f32PulseWidth( 0 ),
    m_ui32BurstLength( 0 ),
    m_ui8AppMode( 0 ),
    m_ui16Padding1( 0 ),
    m_ui8Padding2( 0 )
{
}